

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeHelpers.cpp
# Opt level: O2

double __thiscall UnitTest::Timer::GetTimeInMs(Timer *this)

{
  timeval currentTime;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  return (double)(local_20.tv_sec - (this->m_startTime).tv_sec) * 1000.0 +
         (double)(local_20.tv_usec - (this->m_startTime).tv_usec) / 1000.0;
}

Assistant:

double Timer::GetTimeInMs() const
{
    struct timeval currentTime;
    gettimeofday(&currentTime, 0);

	double const dsecs = currentTime.tv_sec - m_startTime.tv_sec;
    double const dus = currentTime.tv_usec - m_startTime.tv_usec;

	return (dsecs * 1000.0) + (dus / 1000.0);
}